

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O3

basic_bigint<std::allocator<unsigned_char>_> *
jsoncons::basic_bigint<std::allocator<unsigned_char>_>::from_string<wchar_t>
          (basic_bigint<std::allocator<unsigned_char>_> *__return_storage_ptr__,wchar_t *data,
          size_type length)

{
  uint uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  ulong uVar4;
  runtime_error *this;
  long *plVar5;
  size_type *psVar6;
  size_type *psVar7;
  long lVar8;
  basic_bigint<std::allocator<unsigned_char>_> local_118;
  wchar_t *local_f0;
  long local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  basic_bigint<std::allocator<unsigned_char>_> local_a0;
  basic_bigint<std::allocator<unsigned_char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  wVar2 = *data;
  uVar4 = (ulong)(wVar2 == L'-');
  *(byte *)&__return_storage_ptr__->field_0 = *(byte *)&__return_storage_ptr__->field_0 & 0xfc;
  (__return_storage_ptr__->field_0).common_stor_.length_ = 0;
  (__return_storage_ptr__->field_0).short_stor_.values_[0] = 0;
  (__return_storage_ptr__->field_0).short_stor_.values_[1] = 0;
  local_e8 = length - uVar4;
  if (local_e8 != 0) {
    local_f0 = data + uVar4;
    lVar8 = 0;
    do {
      wVar3 = local_f0[lVar8];
      uVar1 = wVar3 + L'\xffffffd0';
      if (9 < uVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Invalid digit ","");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_c0);
        local_e0._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_e0._M_dataplus._M_p == psVar6) {
          local_e0.field_2._M_allocated_capacity = *psVar6;
          local_e0.field_2._8_8_ = plVar5[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar6;
        }
        local_e0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::operator+(&local_50,&local_e0,(char)wVar3);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_118._0_8_ = *plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_118._0_8_ == psVar7) {
          local_118.field_0.common_stor_.length_ = *psVar7;
          local_118.field_0.short_stor_.values_[0] = plVar5[3];
          local_118._0_8_ = (size_type *)((long)&local_118.field_0 + 8);
        }
        else {
          local_118.field_0.common_stor_.length_ = *psVar7;
        }
        local_118.field_0._0_8_ = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::runtime_error::runtime_error(this,(string *)&local_118);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      basic_bigint(&local_a0,__return_storage_ptr__);
      operator*=(&local_a0,10);
      basic_bigint(&local_78,&local_a0);
      jsoncons::operator+(&local_118,&local_78,(ulong)uVar1);
      operator=(__return_storage_ptr__,&local_118);
      if (((local_118.field_0._0_8_ & 1) != 0) &&
         ((pointer)local_118.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_118.field_0.dynamic_stor_.data_,
                        local_118.field_0.short_stor_.values_[0] << 3);
      }
      if (((local_78.field_0._0_1_ & 1) != 0) &&
         ((pointer)local_78.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_78.field_0.dynamic_stor_.data_,
                        local_78.field_0.short_stor_.values_[0] << 3);
      }
      if (((local_a0.field_0._0_1_ & 1) != 0) &&
         ((pointer)local_a0.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_a0.field_0.dynamic_stor_.data_,
                        local_a0.field_0.short_stor_.values_[0] << 3);
      }
      lVar8 = lVar8 + 1;
    } while (local_e8 != lVar8);
  }
  if (wVar2 == L'-') {
    *(byte *)&__return_storage_ptr__->field_0 = *(byte *)&__return_storage_ptr__->field_0 | 2;
  }
  return __return_storage_ptr__;
}

Assistant:

static basic_bigint<Allocator> from_string(const CharT* data, size_type length)
    {
        bool neg;
        if (*data == '-')
        {
            neg = true;
            data++;
            --length;
        }
        else
        {
            neg = false;
        }

        basic_bigint<Allocator> v = 0;
        for (size_type i = 0; i < length; i++)
        {
            CharT c = data[i];
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    v = (v * 10u) + (uint64_t)(c - '0');
                    break;
                default:
                    JSONCONS_THROW(std::runtime_error(std::string("Invalid digit ") + "\'" + (char)c + "\'"));
            }
        }

        if (neg)
        {
            v.common_stor_.is_negative_ = true;
        }

        return v;
    }